

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

boolean dig_corridor(level *lev,coord *org,coord *dest,boolean nxcor,schar ftyp,schar btyp)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  schar *psVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  schar *psVar16;
  boolean bVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  uint x;
  ulong uVar28;
  
  cVar1 = org->x;
  cVar2 = org->y;
  cVar3 = dest->x;
  cVar4 = dest->y;
  uVar6 = 0;
  bVar17 = '\0';
  if (cVar4 < '\x15' &&
      ((cVar2 < '\x15' && (cVar3 < 'P' && cVar1 < 0x50)) &&
      (('\0' < cVar4 && '\0' < cVar3) && ('\0' < cVar2 && '\0' < cVar1)))) {
    uVar26 = (uint)cVar3;
    uVar23 = 1;
    if (cVar3 <= cVar1) {
      uVar23 = 0;
      if (cVar2 < cVar4) {
        uVar6 = 1;
      }
      else {
        uVar6 = -(uint)(cVar1 <= cVar3);
        uVar23 = -(uint)(cVar3 < cVar1);
      }
    }
    uVar12 = (uint)cVar4;
    uVar27 = (int)cVar1 - uVar23;
    uVar28 = (ulong)uVar27;
    uVar9 = (ulong)((int)cVar2 - uVar6);
    bVar17 = '\x01';
    if ((uVar27 != uVar26) || ((int)cVar2 - uVar6 != uVar12)) {
      uVar27 = 0;
      do {
        if (uVar27 == 0x1f5) {
          uVar27 = 0x1f5;
LAB_0024a9d9:
          if (nxcor != '\0') {
            return '\0';
          }
          warning("dig_corridor: giving up after %d tries",(ulong)uVar27);
          return '\0';
        }
        if ((nxcor != '\0') && (uVar7 = mt_random(), uVar7 * -0x75075075 < 0x7507508))
        goto LAB_0024a9d9;
        iVar19 = (int)uVar28;
        x = uVar23 + iVar19;
        uVar28 = (ulong)x;
        iVar18 = (int)uVar9;
        uVar7 = iVar18 + uVar6;
        uVar9 = (ulong)uVar7;
        if (((uVar23 + iVar19) - 0x4f < 0xffffffb2) || ((iVar18 + uVar6) - 0x14 < 0xffffffed)) {
          if (nxcor != '\0') {
            return '\0';
          }
          pcVar11 = "dig_corridor: hit level edge [%d,%d]";
LAB_0024aa10:
          warning(pcVar11,uVar28,uVar9);
          return '\0';
        }
        cVar1 = lev->locations[uVar28][uVar9].typ;
        if (cVar1 == btyp) {
          psVar10 = &lev->locations[uVar28][uVar9].typ;
          if ((ftyp == '\x18') &&
             (uVar8 = mt_random(), (uVar8 * -0x3d70a3d7 >> 2 | uVar8 * 0x40000000) < 0x28f5c29)) {
            *psVar10 = '\x18';
          }
          else {
            *psVar10 = ftyp;
            if ((nxcor != '\0') &&
               (uVar8 = mt_random(),
               (uVar8 * -0x3d70a3d7 >> 1 | (uint)((uVar8 * -0x3d70a3d7 & 1) != 0) << 0x1f) <
               0x51eb852)) {
              mksobj_at(0x214,lev,x,uVar7,'\x01','\0');
            }
          }
        }
        else if (cVar1 != '\x10' && cVar1 != ftyp) {
          if (nxcor != '\0') {
            return '\0';
          }
          pcVar11 = "dig_corridor: trying to dig disallowed tile [%d,%d]";
          goto LAB_0024aa10;
        }
        uVar13 = x - uVar26;
        uVar8 = -uVar13;
        if (0 < (int)uVar13) {
          uVar8 = uVar13;
        }
        uVar14 = uVar7 - uVar12;
        uVar13 = -uVar14;
        if (0 < (int)uVar14) {
          uVar13 = uVar14;
        }
        uVar14 = uVar6;
        uVar24 = uVar23;
        if ((uVar6 == 0) ||
           (((uVar8 <= uVar13 && ((-1 < (int)uVar6 || ((int)uVar12 <= (int)uVar7)))) &&
            (((int)uVar6 < 1 || ((int)uVar7 <= (int)uVar12)))))) {
          if (uVar23 == 0) {
            uVar24 = 0;
          }
          else if (((uVar8 < uVar13) || (((int)uVar23 < 0 && ((int)x < (int)uVar26)))) ||
                  ((0 < (int)uVar23 && (uVar24 = 1, (int)uVar26 < (int)x)))) {
            cVar1 = lev->locations[uVar28][(uVar7 + (uint)((int)uVar7 <= (int)uVar12) * 2) - 1].typ;
            uVar14 = (uint)((int)uVar7 <= (int)uVar12) * 2 - 1;
            if (cVar1 != '\x10' && (cVar1 != ftyp && cVar1 != btyp)) {
              uVar14 = uVar6;
            }
            uVar24 = uVar23;
            if (cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp)) {
              uVar8 = 0;
              goto LAB_0024a9b7;
            }
          }
LAB_0024a65c:
          uVar15 = (ulong)(uVar24 + x);
          uVar20 = (ulong)(uVar14 + uVar7);
          cVar1 = lev->locations[uVar15][uVar20].typ;
          uVar8 = uVar24;
          if (((cVar1 != '\x10') && (cVar1 != btyp)) && (cVar1 != ftyp)) {
            if (uVar24 == 0) {
              if (uVar7 == uVar12) {
                bVar25 = (int)uVar26 < (int)x;
                bVar22 = (int)x <= (int)uVar26;
              }
              else {
                psVar10 = &lev->locations[uVar28 + 1][uVar20].typ;
                iVar19 = iVar19 + uVar23;
                pcVar11 = (char *)((long)lev + uVar28 * 0xfc + uVar20 * 0xc + -0xb8);
                lVar21 = 0x4e;
                bVar22 = false;
                bVar25 = false;
                do {
                  iVar19 = iVar19 + 1;
                  if ((bVar25) && (bVar22)) break;
                  if ((uVar28 + lVar21 != 0x4f && -1 < (long)(uVar28 + lVar21 + -0x4f)) &&
                     (bVar5 = !bVar25, bVar25 = true, bVar5)) {
                    if (uVar28 + lVar21 == 0x50) {
                      bVar25 = false;
                    }
                    else {
                      cVar1 = *pcVar11;
                      bVar25 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
                    }
                  }
                  if ((iVar19 < 0x4f) && (bVar5 = !bVar22, bVar22 = true, bVar5)) {
                    if ((0x4d - uVar28) + lVar21 == 0x4e) {
                      bVar22 = false;
                    }
                    else {
                      cVar1 = *psVar10;
                      bVar22 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
                    }
                  }
                  psVar10 = psVar10 + 0xfc;
                  pcVar11 = pcVar11 + -0xfc;
                  lVar21 = lVar21 + -1;
                } while (lVar21 != 0);
              }
              if (((nxcor == '\0') && (!bVar25)) && (!bVar22)) {
                warning("dig_corridor: vertical corridor blocked");
              }
              uVar8 = -(uint)(byte)(~bVar22 | (int)uVar26 < (int)x & bVar25) | 1;
              uVar14 = 0;
            }
            else {
              if (x == uVar26) {
                bVar25 = (int)uVar12 < (int)uVar7;
                bVar22 = (int)uVar7 <= (int)uVar12;
              }
              else {
                psVar16 = &lev->locations[uVar15][uVar9 + 1].typ;
                iVar18 = iVar18 + uVar6;
                psVar10 = &lev->locations[uVar15 - 1][uVar9 + 0x14].typ;
                lVar21 = 0x13;
                bVar22 = false;
                bVar25 = false;
                do {
                  iVar18 = iVar18 + 1;
                  if ((bVar25) && (bVar22)) break;
                  if ((lVar21 + uVar9 != 0x14 && -1 < (long)(lVar21 + uVar9 + -0x14)) &&
                     (bVar5 = !bVar25, bVar25 = true, bVar5)) {
                    if (lVar21 + uVar9 == 0x15) {
                      bVar25 = false;
                    }
                    else {
                      cVar1 = *psVar10;
                      bVar25 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
                    }
                  }
                  if ((iVar18 < 0x14) && (bVar5 = !bVar22, bVar22 = true, bVar5)) {
                    if ((0x12 - uVar9) + lVar21 == 0x13) {
                      bVar22 = false;
                    }
                    else {
                      cVar1 = *psVar16;
                      bVar22 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
                    }
                  }
                  psVar16 = psVar16 + 0xc;
                  psVar10 = psVar10 + -0xc;
                  lVar21 = lVar21 + -1;
                } while (lVar21 != 0);
              }
              if (((nxcor == '\0') && (!bVar25)) && (!bVar22)) {
                warning("dig_corridor: horizontal corridor blocked");
              }
              uVar14 = -(uint)(byte)(~bVar22 | (int)uVar12 < (int)uVar7 & bVar25) | 1;
              uVar8 = 0;
            }
            cVar1 = lev->locations[uVar8 + x][uVar14 + uVar7].typ;
            if (((cVar1 != '\x10') && (cVar1 != btyp)) && (cVar1 != ftyp)) {
              uVar14 = -uVar14;
              uVar8 = -uVar8;
            }
          }
        }
        else {
          cVar1 = lev->locations[(x + (uint)((int)x <= (int)uVar26) * 2) - 1][uVar9].typ;
          if (cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp)) {
            uVar14 = 0;
          }
          uVar8 = (uint)((int)x <= (int)uVar26) * 2 - 1;
          if (cVar1 != '\x10' && (cVar1 != ftyp && cVar1 != btyp)) goto LAB_0024a65c;
        }
LAB_0024a9b7:
        uVar23 = uVar8;
        uVar6 = uVar14;
        uVar27 = uVar27 + 1;
      } while ((x != uVar26) || (uVar7 != uVar12));
      bVar17 = '\x01';
    }
  }
  return bVar17;
}

Assistant:

boolean dig_corridor(struct level *lev, coord *org, coord *dest, boolean nxcor,
		     schar ftyp, schar btyp)
{
	int dx = 0, dy = 0, dix, diy, cct;
	struct rm *crm;
	int tx, ty, xx, yy;

	xx = org->x;
	yy = org->y;
	tx = dest->x;
	ty = dest->y;
	if (xx <= 0 || yy <= 0 || tx <= 0 || ty <= 0 ||
	    xx > COLNO - 1 || tx > COLNO - 1 ||
	    yy > ROWNO - 1 || ty > ROWNO - 1)
	    return FALSE;

	if (tx > xx)		dx = 1;
	else if (ty > yy)	dy = 1;
	else if (tx < xx)	dx = -1;
	else			dy = -1;

	xx -= dx;
	yy -= dy;
	cct = 0;
	while (xx != tx || yy != ty) {
	    /* loop: dig corridor at [xx,yy] and find new [xx,yy] */
	    if (cct++ > 500 || (nxcor && !rn2(35))) {
		if (!nxcor)
		    warning("dig_corridor: giving up after %d tries", cct - 1);
		return FALSE;
	    }

	    xx += dx;
	    yy += dy;

	    if (xx >= COLNO - 1 || xx <= 0 || yy <= 0 || yy >= ROWNO - 1) {
		/* should be impossible */
		if (!nxcor)
		    warning("dig_corridor: hit level edge [%d,%d]", xx, yy);
		return FALSE;
	    }

	    crm = &lev->locations[xx][yy];
	    if (crm->typ == btyp) {
		if (ftyp != CORR || rn2(100)) {
		    crm->typ = ftyp;
		    if (nxcor && !rn2(50))
			mksobj_at(BOULDER, lev, xx, yy, TRUE, FALSE);
		} else {
		    crm->typ = CORR;	/* formerly secret corridor */
		}
	    } else
	    if (crm->typ != ftyp && crm->typ != SCORR) {
		/* strange ... */
		if (!nxcor) {
		    warning("dig_corridor: trying to dig disallowed tile [%d,%d]",
			    xx, yy);
		}
		return FALSE;
	    }

	    /* find next corridor position */
	    dix = abs(xx-tx);
	    diy = abs(yy-ty);

	    /* do we have to change direction ? */
	    if (dy && (dix > diy ||
		       (dy < 0 && yy < ty) ||
		       (dy > 0 && yy > ty))) {
		int ddx = (xx > tx) ? -1 : 1;

		crm = &lev->locations[xx + ddx][yy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dx = ddx;
		    dy = 0;
		    continue;
		}
	    } else if (dx && (diy > dix ||
			      (dx < 0 && xx < tx) ||
			      (dx > 0 && xx > tx))) {
		int ddy = (yy > ty) ? -1 : 1;

		crm = &lev->locations[xx][yy + ddy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dy = ddy;
		    dx = 0;
		    continue;
		}
	    }

	    /* continue straight on? */
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;

	    /* no, what must we do now?? */
	    if (dx) {
		/* should we go up or down? */
		boolean upok = FALSE;
		boolean downok = FALSE;
		if (xx == tx) {
		    if (yy > ty) upok = TRUE;
		    else downok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < ROWNO - 1; i++) {
			if (upok && downok)
			    break;
			if (yy - i > 0) {
			    crm = &lev->locations[xx + dx][yy - i];
			    if (!upok &&
				yy - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				upok = TRUE;
			}
			if (yy + i < ROWNO - 1) {
			    crm = &lev->locations[xx + dx][yy + i];
			    if (!downok &&
				yy + i + 1 < ROWNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				downok = TRUE;
			}
		    }
		}
		if (!nxcor && !upok && !downok)
		    warning("dig_corridor: horizontal corridor blocked");
		dx = 0;
		dy = ((yy > ty && upok) || !downok) ? -1 : 1;
	    } else {
		/* should we go left or right? */
		boolean leftok = FALSE;
		boolean rightok = FALSE;
		if (yy == ty) {
		    if (xx > tx) leftok = TRUE;
		    else rightok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < COLNO - 1; i++) {
			if (leftok && rightok)
			    break;
			if (xx - i > 0) {
			    crm = &lev->locations[xx - i][yy + dy];
			    if (!leftok &&
				xx - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				leftok = TRUE;
			}
			if (xx + i < COLNO - 1) {
			    crm = &lev->locations[xx + i][yy + dy];
			    if (!rightok &&
				xx + i + 1 < COLNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				rightok = TRUE;
			}
		    }
		}
		if (!nxcor && !leftok && !rightok)
		    warning("dig_corridor: vertical corridor blocked");
		dx = ((xx > tx && leftok) || !rightok) ? -1 : 1;
		dy = 0;
	    }
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;
	    dy = -dy;
	    dx = -dx;
	}
	return TRUE;
}